

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlNewInputFromIO(char *url,xmlInputReadCallback ioRead,xmlInputCloseCallback ioClose,void *ioCtxt,
                 int flags)

{
  xmlParserInputBufferPtr buf_00;
  xmlParserInputBufferPtr buf;
  int flags_local;
  void *ioCtxt_local;
  xmlInputCloseCallback ioClose_local;
  xmlInputReadCallback ioRead_local;
  char *url_local;
  
  if (ioRead == (xmlInputReadCallback)0x0) {
    url_local = (char *)0x0;
  }
  else {
    buf_00 = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf_00 == (xmlParserInputBufferPtr)0x0) {
      if (ioClose != (xmlInputCloseCallback)0x0) {
        (*ioClose)(ioCtxt);
      }
      url_local = (char *)0x0;
    }
    else {
      buf_00->context = ioCtxt;
      buf_00->readcallback = ioRead;
      buf_00->closecallback = ioClose;
      url_local = (char *)xmlNewInputInternal(buf_00,url);
    }
  }
  return (xmlParserInputPtr)url_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromIO(const char *url, xmlInputReadCallback ioRead,
                  xmlInputCloseCallback ioClose, void *ioCtxt,
                  int flags ATTRIBUTE_UNUSED) {
    xmlParserInputBufferPtr buf;

    if (ioRead == NULL)
	return(NULL);

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        if (ioClose != NULL)
            ioClose(ioCtxt);
        return(NULL);
    }

    buf->context = ioCtxt;
    buf->readcallback = ioRead;
    buf->closecallback = ioClose;

    return(xmlNewInputInternal(buf, url));
}